

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O3

int main(int ac,char **av)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  uint ac_00;
  int iVar4;
  int iVar5;
  char **av_00;
  undefined4 extraout_var;
  size_t sVar6;
  string *psVar7;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string config;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  string local_3a8;
  string local_380;
  undefined8 local_360;
  string local_358;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  CommandLineArguments local_2f8;
  undefined1 local_2e0 [688];
  
  cmsys::Encoding::CommandLineArguments::Main(&local_2f8,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc(&local_2f8);
  av_00 = cmsys::Encoding::CommandLineArguments::argv(&local_2f8);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*av_00);
  if (1 < (int)ac_00) {
    pcVar1 = av_00[1];
    iVar4 = strcmp(pcVar1,"--build");
    if (iVar4 == 0) {
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity =
           local_3a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      local_380.field_2._M_allocated_capacity._0_4_ = 0x75626544;
      local_380.field_2._M_allocated_capacity._4_2_ = 0x67;
      local_380._M_string_length = 5;
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      local_338._M_string_length = 0;
      local_338.field_2._M_local_buf[0] = '\0';
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (ac_00 == 2) {
LAB_00221779:
        iVar4 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --target <tgt> = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --use-stderr   = Ignored.  Behavior is default in CMake >= 3.0.\n  --             = Pass remaining options to the native tool.\n"
                   ,0x1ed);
      }
      else {
        iVar4 = 1;
        uVar8 = 2;
        local_360 = 0;
        do {
          if (iVar4 == 4) {
            std::__cxx11::string::string((string *)local_2e0,av_00[uVar8],(allocator *)&local_358);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e0);
            if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
              operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
            }
            iVar4 = 4;
          }
          else {
            pcVar1 = av_00[uVar8];
            iVar5 = strcmp(pcVar1,"--target");
            if (iVar5 == 0) {
              iVar4 = 2;
            }
            else {
              iVar5 = strcmp(pcVar1,"--config");
              if (iVar5 == 0) {
                iVar4 = 3;
              }
              else {
                iVar5 = strcmp(pcVar1,"--clean-first");
                if (iVar5 == 0) {
                  local_360 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
                  iVar4 = 0;
                }
                else {
                  iVar5 = strcmp(pcVar1,"--use-stderr");
                  if (iVar5 != 0) {
                    if (((*pcVar1 == '-') && (pcVar1[1] == '-')) && (pcVar1[2] == '\0')) {
                      iVar4 = 4;
                    }
                    else {
                      if (iVar4 == 3) {
                        psVar7 = &local_380;
                      }
                      else {
                        psVar7 = &local_3a8;
                        if (iVar4 != 2) {
                          if (iVar4 == 1) {
                            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                            sVar6 = strlen(pcVar1);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_358,pcVar1,pcVar1 + sVar6);
                            cmsys::SystemTools::CollapseFullPath((string *)local_2e0,&local_358);
                            std::__cxx11::string::operator=
                                      ((string *)&local_338,(string *)local_2e0);
                            if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
                              operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                            }
                            iVar4 = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
                              operator_delete(local_358._M_dataplus._M_p,
                                              local_358.field_2._M_allocated_capacity + 1);
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,"Unknown argument ",0x11);
                            pcVar1 = av_00[uVar8];
                            if (pcVar1 == (char *)0x0) {
                              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x5d6bc0);
                            }
                            else {
                              sVar6 = strlen(pcVar1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,pcVar1,sVar6);
                            }
                            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
                            std::ostream::put(-0x40);
                            std::ostream::flush();
                            std::__cxx11::string::_M_replace
                                      ((ulong)&local_338,0,(char *)local_338._M_string_length,
                                       0x50ff0f);
                          }
                          goto LAB_0022157a;
                        }
                      }
                      pcVar2 = (char *)psVar7->_M_string_length;
                      strlen(pcVar1);
                      std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar2,(ulong)pcVar1);
                      iVar4 = 0;
                    }
                  }
                }
              }
            }
          }
LAB_0022157a:
          uVar8 = uVar8 + 1;
        } while (ac_00 != uVar8);
        if ((char *)local_338._M_string_length == (char *)0x0) goto LAB_00221779;
        bVar3 = cmsys::SystemTools::StringStartsWith(local_380._M_dataplus._M_p,".\\");
        if (bVar3) {
          std::__cxx11::string::substr((ulong)local_2e0,(ulong)&local_380);
          std::__cxx11::string::operator=((string *)&local_380,(string *)local_2e0);
          if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
          }
        }
        cmake::cmake((cmake *)local_2e0);
        iVar4 = cmake::Build((cmake *)local_2e0,&local_338,&local_3a8,&local_380,&local_318,
                             (bool)((byte)local_360 & 1));
        cmake::~cmake((cmake *)local_2e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                                 local_338.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        CONCAT26(local_380.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_380.field_2._M_allocated_capacity._4_2_,
                                          local_380.field_2._M_allocated_capacity._0_4_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00221321;
    }
    if (((*pcVar1 == '-') && (pcVar1[1] == 'E')) && (pcVar1[2] == '\0')) {
      local_3a8._M_dataplus._M_p = (pointer)0x0;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8,(ulong)(ac_00 - 1));
      std::__cxx11::string::string((string *)local_2e0,*av_00,(allocator *)&local_380);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
      if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<char_const*const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8,
                 local_3a8._M_string_length,av_00 + 2,av_00 + ac_00);
      iVar4 = cmcmd::ExecuteCMakeCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8);
      goto LAB_00221321;
    }
  }
  iVar4 = do_cmake(ac_00,av_00);
  cmDynamicLoader::FlushCache();
LAB_00221321:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_2f8);
  return iVar4;
}

Assistant:

int main(int ac, char const* const* av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(av[0]);
  if(ac > 1)
    {
    if(strcmp(av[1], "--build") == 0)
      {
      return do_build(ac, av);
      }
    else if(strcmp(av[1], "-E") == 0)
      {
      return do_command(ac, av);
      }
    }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  return ret;
}